

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O2

ZCC_TreeNode * __thiscall
ZCCParseState::InitNode(ZCCParseState *this,size_t size,EZCCTreeNodeType type)

{
  ZCC_TreeNode *pZVar1;
  FString *pFVar2;
  
  pZVar1 = ZCC_AST::InitNode(&this->super_ZCC_AST,size,type,(ZCC_TreeNode *)0x0);
  pFVar2 = FSharedStringArena::Alloc((FSharedStringArena *)this,&this->sc->ScriptName);
  pZVar1->SourceName = pFVar2;
  pZVar1->SourceLump = this->sc->LumpNum;
  return pZVar1;
}

Assistant:

ZCC_TreeNode *ZCCParseState::InitNode(size_t size, EZCCTreeNodeType type)
{
	ZCC_TreeNode *node = ZCC_AST::InitNode(size, type, NULL);
	node->SourceName = Strings.Alloc(sc->ScriptName);
	node->SourceLump = sc->LumpNum;
	return node;
}